

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

int32_t __thiscall
icu_63::MessagePattern::parseArg
          (MessagePattern *this,int32_t index,int32_t argStartLength,int32_t nestingLevel,
          UParseError *parseError,UErrorCode *errorCode)

{
  short sVar1;
  int iVar2;
  bool bVar3;
  UBool UVar4;
  byte bVar5;
  int32_t index_00;
  int32_t limit;
  int32_t value;
  uint uVar6;
  char16_t *pcVar7;
  char16_t cVar8;
  uint uVar9;
  long lVar10;
  UMessagePatternArgType argType;
  uint uVar11;
  uint index_01;
  int iVar12;
  bool bVar13;
  uint local_5c;
  
  iVar2 = this->partsLength;
  addPart(this,UMSGPAT_PART_TYPE_ARG_START,index,argStartLength,0,errorCode);
  if (U_ZERO_ERROR < *errorCode) {
    return 0;
  }
  index_00 = skipWhiteSpace(this,argStartLength + index);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar12 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    iVar12 = (int)sVar1 >> 5;
  }
  if (index_00 == iVar12) {
LAB_0028aa5e:
    setParseError(this,parseError,0);
    *errorCode = U_UNMATCHED_BRACES;
    return 0;
  }
  limit = skipIdentifier(this,index_00);
  value = parseArgNumber(&this->msg,index_00,limit);
  if (value < 0) {
    if (value != -1) goto LAB_0028abe1;
    if (0xffff < limit - index_00) {
      setParseError(this,parseError,index_00);
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
    this->hasArgNames = '\x01';
    addPart(this,UMSGPAT_PART_TYPE_ARG_NAME,index_00,limit - index_00,0,errorCode);
  }
  else {
    if (0x7fff < value || 0xffff < limit - index_00) {
      setParseError(this,parseError,index_00);
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      return 0;
    }
    this->hasArgNumbers = '\x01';
    addPart(this,UMSGPAT_PART_TYPE_ARG_NUMBER,index_00,limit - index_00,value,errorCode);
  }
  local_5c = skipWhiteSpace(this,limit);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar6 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar6 = (int)sVar1 >> 5;
  }
  if (local_5c == uVar6) goto LAB_0028aa5e;
  cVar8 = L'\xffff';
  if (local_5c < uVar6) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar7 = (this->msg).fUnion.fFields.fArray;
    }
    else {
      pcVar7 = (char16_t *)((long)&(this->msg).fUnion + 2);
    }
    cVar8 = pcVar7[(int)local_5c];
  }
  if (cVar8 != L',') {
    if (cVar8 != L'}') {
LAB_0028abe1:
      setParseError(this,parseError,index_00);
      *errorCode = U_PATTERN_SYNTAX_ERROR;
      return 0;
    }
    argType = UMSGPAT_ARG_TYPE_NONE;
    goto LAB_0028ad1f;
  }
  uVar6 = skipWhiteSpace(this,local_5c + 1);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar9 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar9 = (int)sVar1 >> 5;
  }
  index_01 = uVar6;
  if (uVar6 < uVar9 && (int)uVar6 < (int)uVar9) {
    if (((int)sVar1 & 2U) == 0) {
      pcVar7 = (this->msg).fUnion.fFields.fArray;
    }
    else {
      pcVar7 = (char16_t *)((long)&(this->msg).fUnion + 2);
    }
    uVar11 = uVar6;
    lVar10 = (long)(int)uVar6;
    do {
      index_01 = uVar11;
      if ((((ushort)pcVar7[lVar10] & 0xffffffdf) - 0x5b < 0xffffffe6) ||
         (index_01 = uVar9, (long)(int)uVar9 <= lVar10 + 1)) break;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + 1;
    } while (uVar11 < uVar9);
  }
  local_5c = skipWhiteSpace(this,index_01);
  sVar1 = (this->msg).fUnion.fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    uVar9 = (this->msg).fUnion.fFields.fLength;
  }
  else {
    uVar9 = (int)sVar1 >> 5;
  }
  if (local_5c == uVar9) {
    setParseError(this,parseError,0);
    *errorCode = U_UNMATCHED_BRACES;
LAB_0028ad10:
    bVar3 = false;
    argType = UMSGPAT_ARG_TYPE_NONE;
  }
  else {
    if (index_01 == uVar6) {
LAB_0028acf8:
      setParseError(this,parseError,index_00);
      *errorCode = U_PATTERN_SYNTAX_ERROR;
      goto LAB_0028ad10;
    }
    cVar8 = L'\xffff';
    if (local_5c < uVar9) {
      if (((int)sVar1 & 2U) == 0) {
        pcVar7 = (this->msg).fUnion.fFields.fArray;
      }
      else {
        pcVar7 = (char16_t *)((long)&(this->msg).fUnion + 2);
      }
      cVar8 = pcVar7[(int)local_5c];
    }
    if ((cVar8 != L',') && (cVar8 != L'}')) goto LAB_0028acf8;
    iVar12 = index_01 - uVar6;
    if (0xffff < iVar12) {
      setParseError(this,parseError,index_00);
      *errorCode = U_INDEX_OUTOFBOUNDS_ERROR;
      goto LAB_0028ad10;
    }
    argType = UMSGPAT_ARG_TYPE_SIMPLE;
    bVar13 = true;
    if (iVar12 == 0xd) {
      UVar4 = isSelect(this,uVar6);
      if (UVar4 == '\0') {
        bVar3 = false;
        argType = UMSGPAT_ARG_TYPE_SIMPLE;
      }
      else {
        bVar5 = isOrdinal(this,uVar6 + 6);
        bVar13 = bVar5 == 0;
        argType = (uint)bVar5 * 4 + UMSGPAT_ARG_TYPE_SIMPLE;
LAB_0028ae20:
        bVar3 = false;
      }
    }
    else if (iVar12 == 6) {
      UVar4 = isChoice(this,uVar6);
      if (UVar4 == '\0') {
        UVar4 = isPlural(this,uVar6);
        if (UVar4 == '\0') {
          bVar5 = isSelect(this,uVar6);
          bVar13 = bVar5 == 0;
          argType = (uint)bVar5 + (uint)bVar5 * 2 + UMSGPAT_ARG_TYPE_SIMPLE;
        }
        else {
          argType = UMSGPAT_ARG_TYPE_PLURAL;
          bVar13 = false;
        }
        goto LAB_0028ae20;
      }
      argType = UMSGPAT_ARG_TYPE_CHOICE;
      bVar3 = true;
      bVar13 = false;
    }
    else {
      bVar3 = false;
    }
    (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar2].value
         = (int16_t)argType;
    if (bVar13) {
      addPart(this,UMSGPAT_PART_TYPE_ARG_TYPE,uVar6,iVar12,0,errorCode);
    }
    if (cVar8 == L'}') {
      bVar3 = true;
      if (!bVar13) {
        setParseError(this,parseError,index_00);
        *errorCode = U_PATTERN_SYNTAX_ERROR;
        bVar3 = false;
      }
    }
    else {
      iVar12 = local_5c + 1;
      if (bVar13) {
        local_5c = parseSimpleStyle(this,iVar12,parseError,errorCode);
      }
      else if (bVar3) {
        local_5c = parseChoiceStyle(this,iVar12,nestingLevel,parseError,errorCode);
      }
      else {
        local_5c = parsePluralOrSelectStyle(this,argType,iVar12,nestingLevel,parseError,errorCode);
      }
      bVar3 = true;
    }
  }
  if (!bVar3) {
    return 0;
  }
LAB_0028ad1f:
  (this->partsList->super_MessagePatternList<icu_63::MessagePattern::Part,_32>).a.ptr[iVar2].
  limitPartIndex = this->partsLength;
  addPart(this,UMSGPAT_PART_TYPE_ARG_LIMIT,local_5c,1,argType,errorCode);
  return local_5c + 1;
}

Assistant:

int32_t
MessagePattern::parseArg(int32_t index, int32_t argStartLength, int32_t nestingLevel,
                         UParseError *parseError, UErrorCode &errorCode) {
    int32_t argStart=partsLength;
    UMessagePatternArgType argType=UMSGPAT_ARG_TYPE_NONE;
    addPart(UMSGPAT_PART_TYPE_ARG_START, index, argStartLength, argType, errorCode);
    if(U_FAILURE(errorCode)) {
        return 0;
    }
    int32_t nameIndex=index=skipWhiteSpace(index+argStartLength);
    if(index==msg.length()) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    // parse argument name or number
    index=skipIdentifier(index);
    int32_t number=parseArgNumber(nameIndex, index);
    if(number>=0) {
        int32_t length=index-nameIndex;
        if(length>Part::MAX_LENGTH || number>Part::MAX_VALUE) {
            setParseError(parseError, nameIndex);  // Argument number too large.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        hasArgNumbers=TRUE;
        addPart(UMSGPAT_PART_TYPE_ARG_NUMBER, nameIndex, length, number, errorCode);
    } else if(number==UMSGPAT_ARG_NAME_NOT_NUMBER) {
        int32_t length=index-nameIndex;
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, nameIndex);  // Argument name too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        hasArgNames=TRUE;
        addPart(UMSGPAT_PART_TYPE_ARG_NAME, nameIndex, length, 0, errorCode);
    } else {  // number<-1 (ARG_NAME_NOT_VALID)
        setParseError(parseError, nameIndex);  // Bad argument syntax.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    }
    index=skipWhiteSpace(index);
    if(index==msg.length()) {
        setParseError(parseError, 0);  // Unmatched '{' braces in message.
        errorCode=U_UNMATCHED_BRACES;
        return 0;
    }
    UChar c=msg.charAt(index);
    if(c==u_rightCurlyBrace) {
        // all done
    } else if(c!=u_comma) {
        setParseError(parseError, nameIndex);  // Bad argument syntax.
        errorCode=U_PATTERN_SYNTAX_ERROR;
        return 0;
    } else /* ',' */ {
        // parse argument type: case-sensitive a-zA-Z
        int32_t typeIndex=index=skipWhiteSpace(index+1);
        while(index<msg.length() && isArgTypeChar(msg.charAt(index))) {
            ++index;
        }
        int32_t length=index-typeIndex;
        index=skipWhiteSpace(index);
        if(index==msg.length()) {
            setParseError(parseError, 0);  // Unmatched '{' braces in message.
            errorCode=U_UNMATCHED_BRACES;
            return 0;
        }
        if(length==0 || ((c=msg.charAt(index))!=u_comma && c!=u_rightCurlyBrace)) {
            setParseError(parseError, nameIndex);  // Bad argument syntax.
            errorCode=U_PATTERN_SYNTAX_ERROR;
            return 0;
        }
        if(length>Part::MAX_LENGTH) {
            setParseError(parseError, nameIndex);  // Argument type name too long.
            errorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }
        argType=UMSGPAT_ARG_TYPE_SIMPLE;
        if(length==6) {
            // case-insensitive comparisons for complex-type names
            if(isChoice(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_CHOICE;
            } else if(isPlural(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_PLURAL;
            } else if(isSelect(typeIndex)) {
                argType=UMSGPAT_ARG_TYPE_SELECT;
            }
        } else if(length==13) {
            if(isSelect(typeIndex) && isOrdinal(typeIndex+6)) {
                argType=UMSGPAT_ARG_TYPE_SELECTORDINAL;
            }
        }
        // change the ARG_START type from NONE to argType
        partsList->a[argStart].value=(int16_t)argType;
        if(argType==UMSGPAT_ARG_TYPE_SIMPLE) {
            addPart(UMSGPAT_PART_TYPE_ARG_TYPE, typeIndex, length, 0, errorCode);
        }
        // look for an argument style (pattern)
        if(c==u_rightCurlyBrace) {
            if(argType!=UMSGPAT_ARG_TYPE_SIMPLE) {
                setParseError(parseError, nameIndex);  // No style field for complex argument.
                errorCode=U_PATTERN_SYNTAX_ERROR;
                return 0;
            }
        } else /* ',' */ {
            ++index;
            if(argType==UMSGPAT_ARG_TYPE_SIMPLE) {
                index=parseSimpleStyle(index, parseError, errorCode);
            } else if(argType==UMSGPAT_ARG_TYPE_CHOICE) {
                index=parseChoiceStyle(index, nestingLevel, parseError, errorCode);
            } else {
                index=parsePluralOrSelectStyle(argType, index, nestingLevel, parseError, errorCode);
            }
        }
    }
    // Argument parsing stopped on the '}'.
    addLimitPart(argStart, UMSGPAT_PART_TYPE_ARG_LIMIT, index, 1, argType, errorCode);
    return index+1;
}